

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode create_transfer(GlobalConfig *global,CURLSH *share,_Bool *added)

{
  OperationConfig *config;
  bool bVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  undefined8 uVar4;
  char *__s;
  char *pcVar5;
  _Bool capath_from_env;
  int *local_40;
  CURLSH *local_38;
  
  *added = false;
  config = global->current;
  local_38 = share;
  do {
    if (config == (OperationConfig *)0x0) {
      return CURLE_OK;
    }
    *added = false;
    if ((config->url_list == (getout *)0x0) || (config->url_list->url == (char *)0x0)) {
      helpf(global->errors,"no URL specified!\n");
      CVar3 = CURLE_FAILED_INIT;
    }
    else {
      capath_from_env = false;
      CVar2 = CURLE_OK;
      if (config->cacert == (char *)0x0) {
        capath_from_env = false;
        CVar2 = CURLE_OK;
        if (config->capath == (char *)0x0) {
          capath_from_env = false;
          CVar2 = CURLE_OK;
          if (config->insecure_ok == false) {
            uVar4 = curl_easy_init();
            local_40 = (int *)0x0;
            capath_from_env = false;
            CVar2 = curl_easy_getinfo(uVar4,0x40002d,&local_40);
            bVar1 = false;
            CVar3 = CVar2;
            if (CVar2 == CURLE_OK) {
              if (*local_40 == 8) {
                capath_from_env = false;
              }
              else {
                __s = (char *)curl_getenv("CURL_CA_BUNDLE");
                if (__s == (char *)0x0) {
                  __s = (char *)curl_getenv("SSL_CERT_DIR");
                  if (__s == (char *)0x0) {
                    __s = (char *)curl_getenv();
                    if (__s != (char *)0x0) goto LAB_0011456b;
                    capath_from_env = false;
                    __s = (char *)0x0;
                  }
                  else {
                    pcVar5 = strdup(__s);
                    config->capath = pcVar5;
                    capath_from_env = true;
                    if (pcVar5 == (char *)0x0) {
                      curl_free(__s);
                      helpf(global->errors,"out of memory\n");
                      goto LAB_0011461b;
                    }
                  }
LAB_001145b5:
                  bVar1 = true;
                  if (__s != (char *)0x0) {
                    curl_free();
                  }
                }
                else {
LAB_0011456b:
                  pcVar5 = strdup(__s);
                  config->cacert = pcVar5;
                  if (pcVar5 != (char *)0x0) {
                    capath_from_env = false;
                    goto LAB_001145b5;
                  }
                  curl_free(__s);
                  errorf(global,"out of memory\n");
LAB_0011461b:
                  capath_from_env = false;
                  bVar1 = false;
                }
                if (!bVar1) {
                  CVar3 = CURLE_OUT_OF_MEMORY;
                  bVar1 = false;
                  goto LAB_0011463c;
                }
              }
              curl_easy_cleanup(uVar4);
              CVar3 = CURLE_OUT_OF_MEMORY;
              bVar1 = true;
            }
LAB_0011463c:
            if (!bVar1) goto LAB_00114666;
          }
        }
      }
      CVar3 = CVar2;
      if (CVar3 == CURLE_OK) {
        CVar3 = single_transfer(global,config,local_38,capath_from_env,added);
      }
    }
LAB_00114666:
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*added != false) {
      return CURLE_OK;
    }
    config = global->current->next;
    global->current = config;
  } while( true );
}

Assistant:

static CURLcode create_transfer(struct GlobalConfig *global,
                                CURLSH *share,
                                bool *added)
{
  CURLcode result = CURLE_OK;
  *added = FALSE;
  while(global->current) {
    result = transfer_per_config(global, global->current, share, added);
    if(!result && !*added) {
      /* when one set is drained, continue to next */
      global->current = global->current->next;
      continue;
    }
    break;
  }
  return result;
}